

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

void __thiscall soul::SimpleTokeniser::throwError(SimpleTokeniser *this,CompileMessage *message)

{
  CompileMessage local_50;
  CompileMessage *local_18;
  CompileMessage *message_local;
  SimpleTokeniser *this_local;
  
  local_18 = message;
  message_local = (CompileMessage *)this;
  CompileMessage::CompileMessage(&local_50,message);
  CodeLocation::throwError(&(this->super_SOULTokeniser).location,&local_50);
}

Assistant:

[[noreturn]] void throwError (const CompileMessage& message) const override
    {
        location.throwError (message);
    }